

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_descriptor_pkh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  
  if (script_len < 0x19) {
    return -2;
  }
  iVar3 = generate_by_miniscript_pk_h(node,parent,derive_child_num,script,script_len,write_len);
  if (iVar3 == 0) {
    sVar2 = *write_len;
    if (sVar2 == 0) {
      iVar3 = -2;
    }
    else {
      uVar1 = sVar2 + 1;
      iVar3 = -2;
      if (uVar1 < 0x2711 && uVar1 <= script_len) {
        script[sVar2] = 0xac;
        *write_len = uVar1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int generate_by_descriptor_pkh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;

    if (script_len < WALLY_SCRIPTPUBKEY_P2PKH_LEN)
        return WALLY_EINVAL;

    ret = generate_by_miniscript_pk_h(node, parent, derive_child_num, script, script_len, write_len);
    if (ret != WALLY_OK)
        return ret;

    return generate_by_wrapper_c(script, script_len, write_len);
}